

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

bool findInBlock(QTextBlock *block,QRegularExpression *expr,int offset,FindFlags options,
                QTextCursor *cursor)

{
  QTextDocumentPrivate *p;
  QSharedDataPointer<QTextCursorPrivate> QVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  QRegularExpressionMatch *pQVar6;
  int start;
  long in_FS_OFFSET;
  QTextCursor local_68;
  QRegularExpressionMatch match;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::text((QString *)&local_58,block);
  QString::replace((QChar)(char16_t)&local_58,(QChar)0xa0,0x20);
  _match = &DAT_aaaaaaaaaaaaaaaa;
  QRegularExpressionMatch::QRegularExpressionMatch(&match);
  while ((-1 < offset &&
         (pQVar6 = (QRegularExpressionMatch *)(ulong)(uint)offset, pQVar6 <= (ulong)local_58.size)))
  {
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) == 0) {
      uVar3 = QString::indexOf((QRegularExpression *)&local_58,(longlong)expr,pQVar6);
    }
    else {
      uVar3 = QString::lastIndexOf((QRegularExpression *)&local_58,(longlong)expr,pQVar6);
    }
    if (uVar3 == 0xffffffff) break;
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 4) == 0) {
LAB_00451636:
      p = block->p;
      iVar4 = QTextBlock::position(block);
      QTextCursor::QTextCursor(&local_68,p,uVar3 + iVar4);
      QVar1.d.ptr = (totally_ordered_wrapper<QTextCursorPrivate_*>)(cursor->d).d.ptr;
      (cursor->d).d.ptr = (QTextCursorPrivate *)local_68;
      local_68.d.d.ptr =
           (QSharedDataPointer<QTextCursorPrivate>)
           (QSharedDataPointer<QTextCursorPrivate>)QVar1.d.ptr;
      QTextCursor::~QTextCursor(&local_68);
      iVar4 = QTextCursor::position(cursor);
      iVar5 = QRegularExpressionMatch::capturedLength((int)&match);
      QTextCursor::setPosition(cursor,iVar4 + iVar5,KeepAnchor);
      bVar2 = true;
      goto LAB_00451696;
    }
    iVar4 = QRegularExpressionMatch::capturedLength((int)&match);
    iVar4 = iVar4 + uVar3;
    if (((uVar3 == 0) ||
        (bVar2 = QChar::isLetterOrNumber
                           ((uint)*(ushort *)
                                   ((long)local_58.ptr +
                                   ((long)(((ulong)uVar3 << 0x20) + -0x100000000) >> 0x1f))), !bVar2
        )) && (((QRegularExpressionMatch *)(long)iVar4 == (QRegularExpressionMatch *)local_58.size
               || (bVar2 = QChar::isLetterOrNumber((uint)(ushort)local_58.ptr[iVar4]), !bVar2))))
    goto LAB_00451636;
    offset = iVar4 + 1;
    if (((uint)options.super_QFlagsStorageHelper<QTextDocument::FindFlag,_4>.
               super_QFlagsStorage<QTextDocument::FindFlag>.i & 1) != 0) {
      offset = uVar3 - 1;
    }
  }
  bVar2 = false;
LAB_00451696:
  QRegularExpressionMatch::~QRegularExpressionMatch(&match);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool findInBlock(const QTextBlock &block, const QRegularExpression &expr, int offset,
                        QTextDocument::FindFlags options, QTextCursor *cursor)
{
    QString text = block.text();
    text.replace(QChar::Nbsp, u' ');
    QRegularExpressionMatch match;
    int idx = -1;

    while (offset >= 0 && offset <= text.size()) {
        idx = (options & QTextDocument::FindBackward) ?
               text.lastIndexOf(expr, offset, &match) : text.indexOf(expr, offset, &match);
        if (idx == -1)
            return false;

        if (options & QTextDocument::FindWholeWords) {
            const int start = idx;
            const int end = start + match.capturedLength();
            if ((start != 0 && text.at(start - 1).isLetterOrNumber())
                || (end != text.size() && text.at(end).isLetterOrNumber())) {
                //if this is not a whole word, continue the search in the string
                offset = (options & QTextDocument::FindBackward) ? idx-1 : end+1;
                idx = -1;
                continue;
            }
        }
        //we have a hit, return the cursor for that.
        *cursor = QTextCursorPrivate::fromPosition(const_cast<QTextDocumentPrivate *>(QTextDocumentPrivate::get(block)),
                                                   block.position() + idx);
        cursor->setPosition(cursor->position() + match.capturedLength(), QTextCursor::KeepAnchor);
        return true;
    }
    return false;
}